

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O0

void __thiscall tonk::SDKConnection::~SDKConnection(SDKConnection *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__SDKConnection_00128cb0;
  if (in_RDI[3] != 0) {
    tonk_free((TonkConnection)0x11e966);
    in_RDI[3] = 0;
  }
  std::shared_ptr<tonk::SDKConnection>::~shared_ptr((shared_ptr<tonk::SDKConnection> *)0x11e983);
  std::enable_shared_from_this<tonk::SDKConnection>::~enable_shared_from_this
            ((enable_shared_from_this<tonk::SDKConnection> *)0x11e991);
  return;
}

Assistant:

SDKConnection::~SDKConnection()
{
    if (MyConnection != nullptr)
    {
        tonk_free(MyConnection);
        MyConnection = nullptr;
    }
}